

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

int Nwk_ObjLevelNew(Nwk_Obj_t *pObj)

{
  uint uVar1;
  Tim_Man_t *p;
  uint uVar2;
  int iVar3;
  int i;
  Nwk_Obj_t *pNVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  
  p = pObj->pMan->pManTime;
  uVar1 = *(uint *)&pObj->field_0x20;
  uVar2 = uVar1 & 7;
  if ((uVar2 == 4) || (uVar2 == 1)) {
    iVar6 = 0;
    if (p != (Tim_Man_t *)0x0) {
      iVar3 = Tim_ManBoxForCi(p,uVar1 >> 7);
      iVar6 = 0;
      if (-1 < iVar3) {
        i = Tim_ManBoxInputFirst(p,iVar3);
        iVar3 = Tim_ManBoxInputNum(p,iVar3);
        iVar6 = 0;
        if (iVar3 < 1) {
          iVar3 = 0;
          iVar6 = 0;
        }
        while (bVar8 = iVar3 != 0, iVar3 = iVar3 + -1, bVar8) {
          pNVar4 = Nwk_ManCo(pObj->pMan,i);
          if (iVar6 <= pNVar4->Level) {
            iVar6 = pNVar4->Level;
          }
          i = i + 1;
        }
        iVar6 = iVar6 + 1;
      }
    }
  }
  else {
    if ((uVar1 & 6) != 2) {
      __assert_fail("Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                    ,0x2ed,"int Nwk_ObjLevelNew(Nwk_Obj_t *)");
    }
    uVar1 = pObj->nFanins;
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    iVar6 = 0;
    for (; (uVar7 != uVar5 && (pObj->pFanio[uVar5] != (Nwk_Obj_t *)0x0)); uVar5 = uVar5 + 1) {
      iVar3 = pObj->pFanio[uVar5]->Level;
      if (iVar6 <= iVar3) {
        iVar6 = iVar3;
      }
    }
    iVar6 = iVar6 + (uint)(0 < (int)uVar1 && uVar2 == 3);
  }
  return iVar6;
}

Assistant:

int Nwk_ObjLevelNew( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Nwk_Obj_t * pFanin;
    int i, iBox, iTerm1, nTerms, Level = 0;
    if ( Nwk_ObjIsCi(pObj) || Nwk_ObjIsLatch(pObj) )
    {
        if ( pManTime )
        {
            iBox = Tim_ManBoxForCi( pManTime, pObj->PioId );
            if ( iBox >= 0 ) // this CI is an output of the box
            {
                iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pFanin = Nwk_ManCo(pObj->pMan, iTerm1 + i);
                    Level = Abc_MaxInt( Level, Nwk_ObjLevel(pFanin) );
                }
                Level++;
            }
        }
        return Level;
    }
    assert( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj) );
    Nwk_ObjForEachFanin( pObj, pFanin, i )
        Level = Abc_MaxInt( Level, Nwk_ObjLevel(pFanin) );
    return Level + (Nwk_ObjIsNode(pObj) && Nwk_ObjFaninNum(pObj) > 0);
}